

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O1

void __thiscall cfd::core::ConfidentialTxOut::~ConfidentialTxOut(ConfidentialTxOut *this)

{
  *(code **)this = cfd::SignParameter::SignParameter;
  if (*(void **)(this + 0xe0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xe0));
  }
  if (*(void **)(this + 200) != (void *)0x0) {
    operator_delete(*(void **)(this + 200));
  }
  *(undefined ***)(this + 0xa0) = &PTR__ConfidentialNonce_00a937b0;
  if (*(void **)(this + 0xa8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xa8));
  }
  *(undefined ***)(this + 0x78) = &PTR__ConfidentialValue_00a93670;
  if (*(void **)(this + 0x80) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x80));
  }
  *(undefined ***)(this + 0x50) = &PTR__ConfidentialAssetId_00a93640;
  if (*(void **)(this + 0x58) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x58));
  }
  *(code **)this = cfd::core::Transaction::GetWeight;
  Script::~Script((Script *)(this + 0x18));
  return;
}

Assistant:

virtual ~ConfidentialTxOut() {
    // do nothing
  }